

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O1

void __thiscall
duckdb::DlbaEncoder::BeginWrite<duckdb::string_t>
          (DlbaEncoder *this,Allocator *allocator,WriteStream *writer,string_t *first_value)

{
  idx_t iVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var3;
  uchar *puVar4;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> this_00;
  char *pcVar5;
  ulong local_48 [3];
  
  iVar1 = this->total_string_size;
  puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)allocator);
  duckdb::AllocatedData::AllocatedData((AllocatedData *)local_48,allocator,puVar4,iVar1 + 1);
  duckdb::AllocatedData::operator=(&this->buffer,(AllocatedData *)local_48);
  duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_48);
  puVar4 = *(uchar **)&this->field_0x4840;
  uVar2 = *(ulong *)&this->field_0x4848;
  this_00._M_head_impl = (MemoryStream *)operator_new(0x30);
  duckdb::MemoryStream::MemoryStream(this_00._M_head_impl,puVar4,uVar2);
  _Var3._M_head_impl =
       (this->stream).
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  (this->stream).super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>.
  _M_t.super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var3._M_head_impl != (MemoryStream *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 0x10))();
  }
  local_48[0] = (ulong)(first_value->value).pointer.length;
  DbpEncoder::BeginWriteInternal(&this->dbp_encoder,writer,(int64_t *)local_48);
  _Var3._M_head_impl =
       (this->stream).
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  if ((first_value->value).pointer.length < 0xd) {
    pcVar5 = (char *)((long)&first_value->value + 4);
  }
  else {
    pcVar5 = (first_value->value).pointer.ptr;
  }
  (*(code *)**(undefined8 **)_Var3._M_head_impl)(_Var3._M_head_impl,pcVar5);
  return;
}

Assistant:

inline void DlbaEncoder::BeginWrite(Allocator &allocator, WriteStream &writer, const string_t &first_value) {
	buffer = allocator.Allocate(total_string_size + 1);
	stream = make_unsafe_uniq<MemoryStream>(buffer.get(), buffer.GetSize());
	dbp_encoder.BeginWrite(writer, UnsafeNumericCast<int64_t>(first_value.GetSize()));
	stream->WriteData(const_data_ptr_cast(first_value.GetData()), first_value.GetSize());
}